

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.cpp
# Opt level: O0

void __thiscall GcHeap::GcHeapImpl::Collect(GcHeapImpl *this)

{
  size_t sVar1;
  Sexp *this_00;
  bool bVar2;
  reference ppSVar3;
  reference ppSVar4;
  mapped_type *ppSVar5;
  const_iterator local_90;
  const_iterator local_88;
  _List_node_base *local_80;
  mapped_type local_78;
  Sexp *forward_ptr;
  _Self local_68;
  iterator it;
  anon_class_8_1_8991fb9c local_48;
  function<void_(Sexp_**)> local_40;
  Sexp *local_20;
  Sexp *ptr;
  GcHeapImpl *local_10;
  GcHeapImpl *this_local;
  
  local_10 = this;
  if ((this->heap_verify & 1U) != 0) {
    VerifyHeap(this);
  }
  this->gc_number = this->gc_number + 1;
  DebugLog("[%d] beginning a GC",this->gc_number);
  bVar2 = std::
          unordered_map<Sexp_*,_Sexp_*,_std::hash<Sexp_*>,_std::equal_to<Sexp_*>,_std::allocator<std::pair<Sexp_*const,_Sexp_*>_>_>
          ::empty(&this->forwarding_addresses);
  if (!bVar2) {
    __assert_fail("forwarding_addresses.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp"
                  ,0xe5,"void GcHeap::GcHeapImpl::Collect()");
  }
  bVar2 = std::vector<Sexp_*,_std::allocator<Sexp_*>_>::empty(&this->worklist);
  if (!bVar2) {
    __assert_fail("worklist.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp"
                  ,0xe6,"void GcHeap::GcHeapImpl::Collect()");
  }
  Flip(this);
  DebugLog("[%d] processing roots",this->gc_number);
  ptr = (Sexp *)this;
  ScanRoots<GcHeap::GcHeapImpl::Collect()::_lambda(Sexp**)_1_>((anon_class_8_1_8991fb9c)this);
  DebugLog("[%d] draining worklist",this->gc_number);
  while( true ) {
    bVar2 = std::vector<Sexp_*,_std::allocator<Sexp_*>_>::empty(&this->worklist);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppSVar3 = std::vector<Sexp_*,_std::allocator<Sexp_*>_>::back(&this->worklist);
    local_20 = *ppSVar3;
    std::vector<Sexp_*,_std::allocator<Sexp_*>_>::pop_back(&this->worklist);
    this_00 = local_20;
    local_48.this = this;
    std::function<void(Sexp**)>::function<GcHeap::GcHeapImpl::Collect()::_lambda(Sexp**)_2_,void>
              ((function<void(Sexp**)> *)&local_40,&local_48);
    Sexp::TracePointers(this_00,&local_40);
    std::function<void_(Sexp_**)>::~function(&local_40);
  }
  DebugLog("[%d] finalizing dead objects",this->gc_number);
  it._M_node = (_List_node_base *)this;
  std::__cxx11::list<Sexp*,std::allocator<Sexp*>>::
  remove_if<GcHeap::GcHeapImpl::Collect()::_lambda(Sexp*)_1_>
            ((list<Sexp*,std::allocator<Sexp*>> *)&this->finalize_queue,
             (anon_class_8_1_8991fb9c)this);
  DebugLog("[%d] updating pointers in finalizer queue",this->gc_number);
  local_68._M_node =
       (_List_node_base *)
       std::__cxx11::list<Sexp_*,_std::allocator<Sexp_*>_>::begin(&this->finalize_queue);
  while( true ) {
    forward_ptr = (Sexp *)std::__cxx11::list<Sexp_*,_std::allocator<Sexp_*>_>::end
                                    (&this->finalize_queue);
    bVar2 = std::operator!=(&local_68,(_Self *)&forward_ptr);
    if (!bVar2) {
      DebugLog("[%d] GC complete",this->gc_number);
      std::
      unordered_map<Sexp_*,_Sexp_*,_std::hash<Sexp_*>,_std::equal_to<Sexp_*>,_std::allocator<std::pair<Sexp_*const,_Sexp_*>_>_>
      ::clear(&this->forwarding_addresses);
      std::vector<Sexp_*,_std::allocator<Sexp_*>_>::clear(&this->worklist);
      if ((this->heap_verify & 1U) != 0) {
        VerifyHeap(this);
      }
      return;
    }
    ppSVar4 = std::_List_iterator<Sexp_*>::operator*(&local_68);
    ppSVar5 = std::
              unordered_map<Sexp_*,_Sexp_*,_std::hash<Sexp_*>,_std::equal_to<Sexp_*>,_std::allocator<std::pair<Sexp_*const,_Sexp_*>_>_>
              ::operator[](&this->forwarding_addresses,ppSVar4);
    local_78 = *ppSVar5;
    if (local_78 == (mapped_type)0x0) break;
    sVar1 = this->gc_number;
    ppSVar4 = std::_List_iterator<Sexp_*>::operator*(&local_68);
    DebugLog("[%d] finalizer queue relocation: %p -> %p",sVar1,*ppSVar4,local_78);
    std::_List_const_iterator<Sexp_*>::_List_const_iterator(&local_88,&local_68);
    local_80 = (_List_node_base *)
               std::__cxx11::list<Sexp_*,_std::allocator<Sexp_*>_>::erase
                         (&this->finalize_queue,local_88);
    local_68._M_node = local_80;
    std::_List_const_iterator<Sexp_*>::_List_const_iterator(&local_90,&local_68);
    std::__cxx11::list<Sexp_*,_std::allocator<Sexp_*>_>::insert
              (&this->finalize_queue,local_90,&local_78);
  }
  __assert_fail("forward_ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp"
                ,0x11b,"void GcHeap::GcHeapImpl::Collect()");
}

Assistant:

void Collect() {
#ifdef DEBUG
    if (heap_verify) {
      VerifyHeap();
    }
#endif

    gc_number++;
    DebugLog("[%d] beginning a GC", gc_number);
    assert(forwarding_addresses.empty());
    assert(worklist.empty());
    // flip the fromspace and tospace - we're about
    // to relocate all of our live objects to the new tospace.
    Flip();

    // all roots are known to be live. we'll process those first.
    DebugLog("[%d] processing roots", gc_number);
    ScanRoots([&](Sexp **ptr) { Process(ptr); });

    // we've populated our worklist, now we need to process it.
    DebugLog("[%d] draining worklist", gc_number);
    while (!worklist.empty()) {
      Sexp *ptr = worklist.back();
      worklist.pop_back();
      // this pointer has already been relocated - we have to
      // process its transitive closure now.
      ptr->TracePointers([&](Sexp **ref) {
        uint8_t *candidate = (uint8_t *)*ref;
        if (candidate >= tospace && candidate < top) {
          // if this pointer points into tospace, that means
          // we've already relocated it and updated the pointer
          // in this object. we don't need to process it again.
          // in fact, we /can't/ process it again, because if we
          // do, it'll get moved to some other garbage location.
          return;
        }

        Process(ref);
      });
    }

    DebugLog("[%d] finalizing dead objects", gc_number);

    finalize_queue.remove_if([&](Sexp *ptr) {
      // check and see if this pointer got relocated. If it
      // did, it has an entry in the forwarding address table.
      if (forwarding_addresses.find(ptr) == forwarding_addresses.end()) {
        // this is correct because, since the object did not relocate,
        // it's still safe to refer to this object by its fromspace pointer.
        DebugLog("[%d] finalizing object %p", gc_number, ptr);
        ptr->Finalize();
        return true;
      }

      // if the object did relocate, it's still live.
      return false;
    });

    DebugLog("[%d] updating pointers in finalizer queue", gc_number);
    // for everything still live in the finalizer queue, we have to
    // update it to point to its relocated location.
    for (auto it = finalize_queue.begin(); it != finalize_queue.end();) {
      Sexp *forward_ptr = forwarding_addresses[*it];
      assert(forward_ptr != nullptr);
      DebugLog("[%d] finalizer queue relocation: %p -> %p", gc_number, *it,
               forward_ptr);
      it = finalize_queue.erase(it);
      finalize_queue.insert(it, forward_ptr);
    }

    DebugLog("[%d] GC complete", gc_number);
    // and we're done!
    forwarding_addresses.clear();
    worklist.clear();

#ifdef DEBUG
    if (heap_verify) {
      VerifyHeap();
    }
#endif
  }